

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

UCTNode * megumax::expand(Position *pos,UCTNode *selected_node)

{
  bool bVar1;
  UCTNode *in_RSI;
  UCTNode *next_child;
  uint next_child_index;
  MoveList *in_stack_00000020;
  Position *in_stack_00000028;
  MoveList move_list;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *children;
  Position *in_stack_00000138;
  Move in_stack_00000144;
  size_type in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  reference local_8;
  
  UCTNode::children(in_RSI);
  bVar1 = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::empty
                    ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (bVar1) {
    bVar1 = UCTNode::is_terminal(in_RSI);
    local_8 = in_RSI;
    if (!bVar1) {
      libchess::Position::legal_move_list
                ((Position *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = libchess::MoveList::empty((MoveList *)0x127018);
      if (bVar1) {
        UCTNode::is_terminal(in_RSI,true);
      }
      else {
        UCTNode::create_children
                  ((UCTNode *)
                   move_list.values_.
                   super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                   super__Vector_impl_data._M_start,in_stack_00000028,in_stack_00000020);
      }
      libchess::MoveList::~MoveList((MoveList *)0x127090);
    }
  }
  else {
    UCTNode::visited_children(in_RSI);
    UCTNode::increment_visited_children(in_RSI);
    UCTNode::children(in_RSI);
    local_8 = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at
                        ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
    UCTNode::move(local_8);
    libchess::Position::make_move(in_stack_00000138,in_stack_00000144);
  }
  return local_8;
}

Assistant:

UCTNode* expand(Position& pos, UCTNode* selected_node) {
    std::vector<UCTNode>& children = selected_node->children();
    if (children.empty()) {
        if (selected_node->is_terminal()) {
            return selected_node;
        }

        MoveList move_list = pos.legal_move_list();
        if (move_list.empty()) {
            selected_node->is_terminal(true);
            return selected_node;
        }

        selected_node->create_children(pos, move_list);

        return selected_node;
    }

    unsigned next_child_index = selected_node->visited_children();
    selected_node->increment_visited_children();
    UCTNode* next_child = &selected_node->children().at(next_child_index);
    assert(pos.is_legal_move(next_child->move()));
    pos.make_move(next_child->move());
    return next_child;
}